

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

Time __thiscall helics::apps::Player::extractTime(Player *this,string_view str,int lineNumber)

{
  int iVar1;
  long *__nptr;
  int *piVar2;
  longlong lVar3;
  ostream *poVar4;
  time_units defUnit;
  double dVar5;
  undefined1 auVar6 [12];
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  
  defUnit = this->units;
  if (defUnit == ns) {
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,str._M_str,str._M_str + str._M_len);
    __nptr = local_58[0];
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *piVar2 = 0;
    lVar3 = strtoll((char *)__nptr,(char **)&local_38,10);
    if (local_38 == __nptr) {
      auVar6 = std::__throw_invalid_argument("stoll");
      if (auVar6._8_4_ == 1) {
        __cxa_begin_catch(auVar6._0_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"ill formed time on line ",0x18);
        poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,iVar1);
        local_58[0] = (long *)CONCAT71(local_58[0]._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_58,1);
        __cxa_end_catch();
        return (Time)-0x7fffffffffffffff;
      }
      _Unwind_Resume(auVar6._0_8_);
    }
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    else if (*piVar2 == 0x22) {
      str = (string_view)std::__throw_out_of_range("stoll");
      goto LAB_0027133d;
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  else {
LAB_0027133d:
    dVar5 = gmlc::utilities::getTimeValue((string_view)str,defUnit);
    lVar3 = -0x7fffffffffffffff;
    if (-9223372036.854765 < dVar5) {
      if (9223372036.854765 <= dVar5) {
        lVar3 = 0x7fffffffffffffff;
      }
      else {
        lVar3 = (longlong)
                (dVar5 * 1000000000.0 +
                *(double *)(&DAT_00429020 + (ulong)(0.0 <= dVar5 * 1000000000.0) * 8));
      }
    }
  }
  return (Time)lVar3;
}

Assistant:

helics::Time Player::extractTime(std::string_view str, int lineNumber) const
{
    try {
        if (units == time_units::ns)  // ns
        {
            return {std::stoll(std::string(str)), time_units::ns};
        }
        return loadTimeFromString(str, units);
    }
    catch (const std::invalid_argument&) {
        std::cerr << "ill formed time on line " << lineNumber << '\n';
        return helics::Time::minVal();
    }
}